

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

unique_ptr<argo::json,_std::default_delete<argo::json>_> __thiscall
argo::parser::parse(parser *this,char *s)

{
  allocator local_1a9;
  string local_1a8 [32];
  istringstream i;
  
  std::__cxx11::string::string(local_1a8,s,&local_1a9);
  std::__cxx11::istringstream::istringstream((istringstream *)&i,local_1a8,_S_in);
  std::__cxx11::string::~string(local_1a8);
  parse(this,(istream *)&i);
  std::__cxx11::istringstream::~istringstream((istringstream *)&i);
  return (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)
         (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)this;
}

Assistant:

unique_ptr<json> parser::parse(const char *s)
{
    istringstream i(s);
    return parse(i);
}